

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::resize_nearest(Mat *src,Mat *dst,int w,int h,Option *opt)

{
  Layer *pLVar1;
  ParamDict pd;
  
  pLVar1 = create_layer(0x32);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,1);
  ParamDict::set(&pd,3,h);
  ParamDict::set(&pd,4,w);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void resize_nearest(const Mat& src, Mat& dst, int w, int h, const Option& opt)
{
    Layer* interp = create_layer(LayerType::Interp);

    ParamDict pd;
    pd.set(0, 1);
    pd.set(3, h);
    pd.set(4, w);

    interp->load_param(pd);

    interp->create_pipeline(opt);

    interp->forward(src, dst, opt);

    interp->destroy_pipeline(opt);

    delete interp;
}